

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_time.cc
# Opt level: O1

ASN1_TIME * ASN1_TIME_adj(ASN1_TIME *s,time_t t,int offset_day,long offset_sec)

{
  int iVar1;
  ASN1_GENERALIZEDTIME *pAVar2;
  tm tm;
  tm tStack_58;
  
  iVar1 = OPENSSL_posix_to_tm(t,&tStack_58);
  if (iVar1 == 0) {
    pAVar2 = (ASN1_GENERALIZEDTIME *)0x0;
    ERR_put_error(0xc,0,0x71,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_time.cc"
                  ,0x35);
  }
  else if ((offset_day == 0 && offset_sec == 0) ||
          (iVar1 = OPENSSL_gmtime_adj(&tStack_58,offset_day,offset_sec), iVar1 != 0)) {
    if (tStack_58.tm_year - 0x96U < 0xffffff9c) {
      pAVar2 = ASN1_GENERALIZEDTIME_adj(s,t,offset_day,offset_sec);
    }
    else {
      pAVar2 = ASN1_UTCTIME_adj(s,t,offset_day,offset_sec);
    }
  }
  else {
    pAVar2 = (ASN1_GENERALIZEDTIME *)0x0;
  }
  return pAVar2;
}

Assistant:

ASN1_TIME *ASN1_TIME_adj(ASN1_TIME *s, int64_t posix_time, int offset_day,
                         long offset_sec) {
  struct tm tm;

  if (!OPENSSL_posix_to_tm(posix_time, &tm)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_ERROR_GETTING_TIME);
    return NULL;
  }
  if (offset_day || offset_sec) {
    if (!OPENSSL_gmtime_adj(&tm, offset_day, offset_sec)) {
      return NULL;
    }
  }
  if (fits_in_utc_time(&tm)) {
    return ASN1_UTCTIME_adj(s, posix_time, offset_day, offset_sec);
  }
  return ASN1_GENERALIZEDTIME_adj(s, posix_time, offset_day, offset_sec);
}